

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double insphereslow(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  double b;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double b_00;
  double b_01;
  double b_02;
  double b_03;
  double dVar24;
  double dVar25;
  double dVar26;
  double b_04;
  double b_05;
  double b_06;
  double b_07;
  double b_08;
  double b_09;
  double b_10;
  double b_11;
  double dVar27;
  double dVar28;
  double dVar29;
  double b_12;
  double dVar30;
  double dVar31;
  double dVar32;
  double b_13;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double b_14;
  double b_15;
  double b_16;
  double b_17;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double b_18;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double b_19;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double b_20;
  double dVar64;
  double b_21;
  double dVar65;
  double dVar66;
  double ac [16];
  double da [16];
  double bc [16];
  double ab [16];
  double temp32a [32];
  double temp64b [64];
  double temp64a [64];
  double temp32b [32];
  double bd [16];
  double cd [16];
  double temp192 [192];
  double temp64c [64];
  double temp128 [128];
  double detzzt [768];
  double detzt [384];
  double detyyt [768];
  double detyt [384];
  double detxxt [768];
  double detxt [384];
  double detzz [768];
  double detz [384];
  double detyy [768];
  double dety [384];
  double detxx [768];
  double detx [384];
  double detztzt [768];
  double detytyt [768];
  double detxtxt [768];
  double y2 [2304];
  double x2 [2304];
  double z1 [1536];
  double y1 [1536];
  double x1 [1536];
  double z2 [2304];
  double detxy [4608];
  double cdet [6912];
  double bdet [6912];
  double adet [6912];
  double ddet [6912];
  double deter [27648];
  double cddet [13824];
  double abdet [13824];
  double dStack_d5458;
  double dStack_d5408;
  double dStack_d5358;
  double dStack_d5340;
  double dStack_d5330;
  double dStack_d5328;
  double dStack_d5200;
  double adStack_d5038 [16];
  double adStack_d4fb8 [16];
  double adStack_d4f38 [16];
  double adStack_d4eb8 [16];
  double adStack_d4e38 [32];
  double adStack_d4d38 [64];
  double adStack_d4b38 [64];
  double adStack_d4938 [32];
  double adStack_d4838 [16];
  double adStack_d47b8 [16];
  double dStack_d4738;
  double dStack_d4730;
  double dStack_d4728;
  double dStack_d4720;
  double dStack_d4718;
  double dStack_d4710;
  double dStack_d4708;
  double dStack_d4700;
  double dStack_d46f8;
  double dStack_d46f0;
  double dStack_d46e8;
  double dStack_d46e0;
  double dStack_d46d8;
  double dStack_d46d0;
  double dStack_d46c8;
  double dStack_d46c0;
  double dStack_d46b8;
  double dStack_d46b0;
  double dStack_d46a8;
  double dStack_d46a0;
  double dStack_d4698;
  double dStack_d4690;
  double dStack_d4688;
  double dStack_d4680;
  double dStack_d4678;
  double dStack_d4670;
  double dStack_d4668;
  double dStack_d4660;
  double dStack_d4658;
  double dStack_d4650;
  double dStack_d4648;
  double dStack_d4640;
  double dStack_d4638;
  double dStack_d4630;
  double dStack_d4628;
  double dStack_d4620;
  double dStack_d4618;
  double dStack_d4610;
  double dStack_d4608;
  double dStack_d4600;
  double dStack_d45f8;
  double dStack_d45f0;
  double dStack_d45e8;
  double dStack_d45e0;
  double dStack_d45d8;
  double dStack_d45d0;
  double dStack_d45c8;
  double dStack_d45c0;
  double dStack_d45b8;
  double dStack_d45b0;
  double dStack_d45a8;
  double dStack_d45a0;
  double dStack_d4598;
  double dStack_d4590;
  double dStack_d4588;
  double dStack_d4580;
  double dStack_d4578;
  double dStack_d4570;
  double dStack_d4568;
  double dStack_d4560;
  double dStack_d4558;
  double dStack_d4550;
  double dStack_d4548;
  double dStack_d4540;
  double dStack_d4538;
  double dStack_d4530;
  double dStack_d4528;
  double dStack_d4520;
  double dStack_d4518;
  undefined1 auStack_d4510 [16];
  double dStack_d4500;
  double dStack_d44f8;
  double dStack_d44f0;
  double dStack_d44e8;
  double dStack_d44e0;
  double dStack_d44d8;
  double dStack_d44d0;
  double dStack_d44c8;
  double dStack_d44c0;
  double dStack_d44b8;
  double dStack_d44b0;
  double dStack_d44a8;
  double dStack_d44a0;
  double dStack_d4498;
  double dStack_d4490;
  double dStack_d4488;
  double dStack_d4480;
  double dStack_d4478;
  double dStack_d4470;
  double dStack_d4468;
  double dStack_d4460;
  double dStack_d4458;
  double dStack_d4450;
  double dStack_d4448;
  double dStack_d4440;
  double adStack_d4438 [192];
  double adStack_d3e38 [64];
  double adStack_d3c38 [128];
  double adStack_d3838 [768];
  double adStack_d2038 [384];
  double adStack_d1438 [768];
  double adStack_cfc38 [384];
  double adStack_cf038 [768];
  double adStack_cd838 [384];
  double adStack_ccc38 [768];
  double adStack_cb438 [384];
  double adStack_ca838 [768];
  double adStack_c9038 [384];
  double adStack_c8438 [768];
  double adStack_c6c38 [384];
  double adStack_c6038 [768];
  double adStack_c4838 [768];
  double adStack_c3038 [768];
  double adStack_c1838 [2304];
  double adStack_bd038 [2304];
  double adStack_b8838 [1536];
  double adStack_b5838 [1536];
  double adStack_b2838 [1536];
  double adStack_af838 [2304];
  double adStack_ab038 [4608];
  double adStack_a2038 [6912];
  double adStack_94838 [6912];
  double adStack_87038 [6912];
  double adStack_79838 [6911];
  double adStack_6c040 [27649];
  double adStack_36038 [13824];
  double adStack_1b038 [13825];
  
  dVar25 = splitter;
  dVar21 = *pa;
  dVar1 = pa[2];
  dVar2 = pe[2];
  b = dVar1 - dVar2;
  dVar22 = *pb;
  dVar20 = pb[2];
  b_00 = dVar20 - dVar2;
  b_04 = (dVar20 - (b_00 + (dVar20 - b_00))) + ((dVar20 - b_00) - dVar2);
  dVar20 = pc[2];
  b_01 = dVar20 - dVar2;
  b_05 = (dVar20 - (b_01 + (dVar20 - b_01))) + ((dVar20 - b_01) - dVar2);
  dVar20 = pd[2];
  b_02 = dVar20 - dVar2;
  b_06 = (dVar20 - (b_02 + (dVar20 - b_02))) + ((dVar20 - b_02) - dVar2);
  dVar20 = *pe;
  dVar23 = pe[1];
  b_07 = dVar21 - dVar20;
  b_13 = (dVar21 - (b_07 + (dVar21 - b_07))) + ((dVar21 - b_07) - dVar20);
  b_21 = dVar22 - dVar20;
  dVar21 = pb[1];
  b_20 = (dVar22 - (b_21 + (dVar22 - b_21))) + ((dVar22 - b_21) - dVar20);
  b_19 = dVar21 - dVar23;
  b_14 = (dVar21 - (b_19 + (dVar21 - b_19))) + ((dVar21 - b_19) - dVar23);
  dVar21 = *pc;
  b_08 = dVar21 - dVar20;
  b_15 = (dVar21 - (b_08 + (dVar21 - b_08))) + ((dVar21 - b_08) - dVar20);
  dVar21 = pc[1];
  b_09 = dVar21 - dVar23;
  b_16 = (dVar21 - (b_09 + (dVar21 - b_09))) + ((dVar21 - b_09) - dVar23);
  dVar21 = pa[1];
  dVar22 = *pd;
  b_10 = dVar21 - dVar23;
  b_12 = dVar22 - dVar20;
  b_17 = (dVar21 - (b_10 + (dVar21 - b_10))) + ((dVar21 - b_10) - dVar23);
  b_18 = (dVar22 - (b_12 + (dVar22 - b_12))) + ((dVar22 - b_12) - dVar20);
  dVar21 = pd[1];
  b_03 = dVar21 - dVar23;
  b_11 = (dVar21 - (b_03 + (dVar21 - b_03))) + ((dVar21 - b_03) - dVar23);
  dVar18 = b_13 * splitter - (b_13 * splitter - b_13);
  dVar19 = b_07 * splitter - (b_07 * splitter - b_07);
  dVar24 = b_14 * splitter - (b_14 * splitter - b_14);
  dVar26 = b_19 * splitter - (b_19 * splitter - b_19);
  dVar20 = b_13 * b_14;
  dVar23 = b_13 * b_19;
  dVar27 = b_13 - dVar18;
  dVar28 = b_14 - dVar24;
  dVar30 = b_19 - dVar26;
  dStack_d4478 = dVar27 * dVar28 -
                 (((dVar20 - dVar18 * dVar24) - dVar27 * dVar24) - dVar18 * dVar28);
  dVar57 = b_07 - dVar19;
  auVar3._8_4_ = SUB84(b_07,0);
  auVar3._0_8_ = b_07;
  auVar3._12_4_ = (int)((ulong)b_07 >> 0x20);
  dVar21 = b_07 * b_14;
  dVar22 = b_07 * b_19;
  dVar58 = dVar57 * dVar28 - (((dVar21 - dVar19 * dVar24) - dVar57 * dVar24) - dVar19 * dVar28);
  dVar61 = dVar57 * dVar30 - (((dVar22 - dVar19 * dVar26) - dVar57 * dVar26) - dVar19 * dVar30);
  dVar28 = dVar20 + dVar58;
  dVar36 = dVar23 + dVar61;
  dVar38 = dVar21 + dVar28;
  dVar45 = dVar28 - (dVar38 - dVar21);
  dVar24 = dVar30 * dVar27 - (((dVar23 - dVar18 * dVar26) - dVar26 * dVar27) - dVar18 * dVar30);
  dVar21 = (dVar20 - (dVar28 - (dVar28 - dVar20))) + (dVar58 - (dVar28 - dVar20));
  dVar20 = (dVar23 - (dVar36 - (dVar36 - dVar23))) + (dVar61 - (dVar36 - dVar23));
  dVar26 = dVar24 + dVar21;
  dVar28 = dVar45 + dVar26;
  dVar30 = (dVar45 - (dVar28 - (dVar28 - dVar45))) + (dVar26 - (dVar28 - dVar45));
  dVar23 = dVar38 + dVar28;
  dVar28 = (dVar38 - (dVar23 - (dVar23 - dVar38))) + (dVar28 - (dVar23 - dVar38));
  dVar38 = dVar20 + dVar30;
  dStack_d4470 = (dVar24 - (dVar26 - dVar21)) + (dVar21 - (dVar26 - (dVar26 - dVar21)));
  dStack_d4468 = (dVar30 - (dVar38 - (dVar38 - dVar30))) + (dVar20 - (dVar38 - dVar30));
  dVar26 = dVar22 + dVar36;
  dVar24 = dVar28 + dVar38;
  dVar20 = dVar23 + dVar24;
  dVar23 = (dVar23 - (dVar20 - (dVar20 - dVar23))) + (dVar24 - (dVar20 - dVar23));
  dVar21 = (dVar22 - (dVar26 - (dVar26 - dVar22))) + (dVar36 - (dVar26 - dVar22));
  dVar22 = (dVar28 - (dVar24 - (dVar24 - dVar28))) + (dVar38 - (dVar24 - dVar28));
  dVar30 = dVar22 + dVar21;
  dVar24 = dVar23 + dVar30;
  dVar23 = (dVar23 - (dVar24 - (dVar24 - dVar23))) + (dVar30 - (dVar24 - dVar23));
  dVar28 = dVar20 + dVar24;
  dVar20 = (dVar20 - (dVar28 - (dVar28 - dVar20))) + (dVar24 - (dVar28 - dVar20));
  dVar24 = dVar23 + dVar26;
  dStack_d4460 = (dVar22 - (dVar30 - (dVar30 - dVar22))) + (dVar21 - (dVar30 - dVar22));
  dStack_d4458 = (dVar23 - (dVar24 - (dVar24 - dVar23))) + (dVar26 - (dVar24 - dVar23));
  dVar21 = dVar20 + dVar24;
  dStack_d4440 = dVar28 + dVar21;
  dStack_d4450 = (dVar20 - (dVar21 - (dVar21 - dVar20))) + (dVar24 - (dVar21 - dVar20));
  dStack_d4448 = (dVar28 - (dStack_d4440 - (dStack_d4440 - dVar28))) +
                 (dVar21 - (dStack_d4440 - dVar28));
  dVar36 = b_20 * splitter - (b_20 * splitter - b_20);
  dVar38 = b_21 * splitter - (b_21 * splitter - b_21);
  dVar21 = -b_17;
  dVar28 = -b_10;
  dVar65 = splitter * dVar21 - (b_17 + splitter * dVar21);
  dVar66 = splitter * dVar28 - (b_10 + splitter * dVar28);
  dVar23 = b_20 * dVar21;
  dVar24 = b_20 * dVar28;
  dVar64 = b_20 - dVar36;
  dVar46 = dVar21 - dVar65;
  dVar52 = dVar28 - dVar66;
  dStack_d45f8 = dVar64 * dVar46 -
                 (((dVar23 - dVar36 * dVar65) - dVar64 * dVar65) - dVar36 * dVar46);
  dVar33 = b_21 - dVar38;
  auVar4._8_4_ = SUB84(b_21,0);
  auVar4._0_8_ = b_21;
  auVar4._12_4_ = (int)((ulong)b_21 >> 0x20);
  dVar22 = b_21 * dVar21;
  dVar20 = b_21 * dVar28;
  dVar47 = dVar33 * dVar46 - (((dVar22 - dVar38 * dVar65) - dVar33 * dVar65) - dVar38 * dVar46);
  dVar53 = dVar33 * dVar52 - (((dVar20 - dVar38 * dVar66) - dVar33 * dVar66) - dVar38 * dVar52);
  dVar30 = dVar23 + dVar47;
  dVar45 = dVar24 + dVar53;
  dVar58 = dVar22 + dVar30;
  dVar26 = dVar30 - (dVar58 - dVar22);
  dVar61 = dVar64 * dVar52 - (((dVar24 - dVar36 * dVar66) - dVar64 * dVar66) - dVar36 * dVar52);
  dVar22 = (dVar23 - (dVar30 - (dVar30 - dVar23))) + (dVar47 - (dVar30 - dVar23));
  dVar23 = (dVar24 - (dVar45 - (dVar45 - dVar24))) + (dVar53 - (dVar45 - dVar24));
  dVar30 = dVar61 + dVar22;
  dVar53 = dVar26 + dVar30;
  dVar47 = (dVar26 - (dVar53 - (dVar53 - dVar26))) + (dVar30 - (dVar53 - dVar26));
  dVar24 = dVar58 + dVar53;
  dVar26 = (dVar58 - (dVar24 - (dVar24 - dVar58))) + (dVar53 - (dVar24 - dVar58));
  dVar53 = dVar23 + dVar47;
  dStack_d45f0 = (dVar61 - (dVar30 - dVar22)) + (dVar22 - (dVar30 - (dVar30 - dVar22)));
  dStack_d45e8 = (dVar47 - (dVar53 - (dVar53 - dVar47))) + (dVar23 - (dVar53 - dVar47));
  dVar58 = dVar20 + dVar45;
  dVar30 = dVar26 + dVar53;
  dVar23 = dVar24 + dVar30;
  dVar24 = (dVar24 - (dVar23 - (dVar23 - dVar24))) + (dVar30 - (dVar23 - dVar24));
  dVar22 = (dVar20 - (dVar58 - (dVar58 - dVar20))) + (dVar45 - (dVar58 - dVar20));
  dVar20 = (dVar26 - (dVar30 - (dVar30 - dVar26))) + (dVar53 - (dVar30 - dVar26));
  dVar45 = dVar20 + dVar22;
  dVar26 = dVar24 + dVar45;
  dVar24 = (dVar24 - (dVar26 - (dVar26 - dVar24))) + (dVar45 - (dVar26 - dVar24));
  dVar30 = dVar23 + dVar26;
  dVar23 = (dVar23 - (dVar30 - (dVar30 - dVar23))) + (dVar26 - (dVar30 - dVar23));
  dVar26 = dVar24 + dVar58;
  dStack_d45e0 = (dVar20 - (dVar45 - (dVar45 - dVar20))) + (dVar22 - (dVar45 - dVar20));
  dStack_d45d8 = (dVar24 - (dVar26 - (dVar26 - dVar24))) + (dVar58 - (dVar26 - dVar24));
  dVar22 = dVar23 + dVar26;
  dStack_d45c0 = dVar30 + dVar22;
  dStack_d45d0 = (dVar23 - (dVar22 - (dVar22 - dVar23))) + (dVar26 - (dVar22 - dVar23));
  dStack_d45c8 = (dVar30 - (dStack_d45c0 - (dStack_d45c0 - dVar30))) +
                 (dVar22 - (dStack_d45c0 - dVar30));
  iVar6 = fast_expansion_sum_zeroelim(8,&dStack_d4478,8,&dStack_d45f8,adStack_d4eb8);
  dVar39 = dVar25 * b_16 - (dVar25 * b_16 - b_16);
  dVar43 = dVar25 * b_09 - (dVar25 * b_09 - b_09);
  dVar23 = b_20 * b_16;
  dVar24 = b_20 * b_09;
  dVar48 = b_16 - dVar39;
  dVar54 = b_09 - dVar43;
  dStack_d44b8 = dVar64 * dVar48 -
                 (((dVar23 - dVar36 * dVar39) - dVar64 * dVar39) - dVar36 * dVar48);
  dStack_d5330 = auVar4._8_8_;
  dVar22 = b_21 * b_16;
  dVar20 = dStack_d5330 * b_09;
  dVar47 = dVar33 * dVar48 - (((dVar22 - dVar38 * dVar39) - dVar33 * dVar39) - dVar38 * dVar48);
  dVar53 = dVar33 * dVar54 - (((dVar20 - dVar38 * dVar43) - dVar33 * dVar43) - dVar38 * dVar54);
  dVar30 = dVar23 + dVar47;
  dVar45 = dVar24 + dVar53;
  dVar58 = dVar22 + dVar30;
  dVar26 = dVar30 - (dVar58 - dVar22);
  dVar61 = dVar64 * dVar54 - (((dVar24 - dVar36 * dVar43) - dVar64 * dVar43) - dVar36 * dVar54);
  dVar22 = (dVar23 - (dVar30 - (dVar30 - dVar23))) + (dVar47 - (dVar30 - dVar23));
  dVar23 = (dVar24 - (dVar45 - (dVar45 - dVar24))) + (dVar53 - (dVar45 - dVar24));
  dVar30 = dVar61 + dVar22;
  dVar53 = dVar26 + dVar30;
  dVar47 = (dVar26 - (dVar53 - (dVar53 - dVar26))) + (dVar30 - (dVar53 - dVar26));
  dVar24 = dVar58 + dVar53;
  dVar26 = (dVar58 - (dVar24 - (dVar24 - dVar58))) + (dVar53 - (dVar24 - dVar58));
  dVar53 = dVar23 + dVar47;
  dStack_d44b0 = (dVar61 - (dVar30 - dVar22)) + (dVar22 - (dVar30 - (dVar30 - dVar22)));
  dStack_d44a8 = (dVar47 - (dVar53 - (dVar53 - dVar47))) + (dVar23 - (dVar53 - dVar47));
  dVar58 = dVar20 + dVar45;
  dVar30 = dVar26 + dVar53;
  dVar23 = dVar24 + dVar30;
  dVar24 = (dVar24 - (dVar23 - (dVar23 - dVar24))) + (dVar30 - (dVar23 - dVar24));
  dVar22 = (dVar20 - (dVar58 - (dVar58 - dVar20))) + (dVar45 - (dVar58 - dVar20));
  dVar20 = (dVar26 - (dVar30 - (dVar30 - dVar26))) + (dVar53 - (dVar30 - dVar26));
  dVar45 = dVar20 + dVar22;
  dVar26 = dVar24 + dVar45;
  dVar24 = (dVar24 - (dVar26 - (dVar26 - dVar24))) + (dVar45 - (dVar26 - dVar24));
  dVar30 = dVar23 + dVar26;
  dVar23 = (dVar23 - (dVar30 - (dVar30 - dVar23))) + (dVar26 - (dVar30 - dVar23));
  dVar26 = dVar24 + dVar58;
  dStack_d44a0 = (dVar20 - (dVar45 - (dVar45 - dVar20))) + (dVar22 - (dVar45 - dVar20));
  dStack_d4498 = (dVar24 - (dVar26 - (dVar26 - dVar24))) + (dVar58 - (dVar26 - dVar24));
  dVar22 = dVar23 + dVar26;
  dStack_d4480 = dVar30 + dVar22;
  dStack_d4490 = (dVar23 - (dVar22 - (dVar22 - dVar23))) + (dVar26 - (dVar22 - dVar23));
  dStack_d4488 = (dVar30 - (dStack_d4480 - (dStack_d4480 - dVar30))) +
                 (dVar22 - (dStack_d4480 - dVar30));
  dVar45 = b_15 * dVar25 - (b_15 * dVar25 - b_15);
  dVar22 = b_15 - dVar45;
  dVar58 = b_08 * dVar25 - (b_08 * dVar25 - b_08);
  dVar63 = b_08 - dVar58;
  dVar20 = -b_14;
  dVar30 = -b_19;
  dVar29 = dVar25 * dVar20 - (dVar25 * dVar20 + b_14);
  dVar31 = dVar25 * dVar30 - (b_19 + dVar25 * dVar30);
  dVar26 = b_15 * dVar20;
  dVar61 = b_15 * dVar30;
  dVar34 = dVar20 - dVar29;
  dVar37 = dVar30 - dVar31;
  dStack_d4638 = dVar22 * dVar34 -
                 (((dVar26 - dVar45 * dVar29) - dVar22 * dVar29) - dVar45 * dVar34);
  auVar5._8_4_ = SUB84(b_08,0);
  auVar5._0_8_ = b_08;
  auVar5._12_4_ = (int)((ulong)b_08 >> 0x20);
  dVar23 = b_08 * dVar20;
  dVar24 = b_08 * dVar30;
  dVar49 = dVar63 * dVar34 - (((dVar23 - dVar58 * dVar29) - dVar63 * dVar29) - dVar58 * dVar34);
  dVar55 = dVar63 * dVar37 - (((dVar24 - dVar58 * dVar31) - dVar63 * dVar31) - dVar58 * dVar37);
  dVar53 = dVar26 + dVar49;
  dVar32 = dVar61 + dVar55;
  dVar35 = dVar23 + dVar53;
  dVar47 = dVar53 - (dVar35 - dVar23);
  dVar40 = dVar22 * dVar37 - (((dVar61 - dVar45 * dVar31) - dVar22 * dVar31) - dVar45 * dVar37);
  dVar23 = (dVar26 - (dVar53 - (dVar53 - dVar26))) + (dVar49 - (dVar53 - dVar26));
  dVar26 = (dVar61 - (dVar32 - (dVar32 - dVar61))) + (dVar55 - (dVar32 - dVar61));
  dVar53 = dVar40 + dVar23;
  dVar55 = dVar47 + dVar53;
  dVar49 = (dVar47 - (dVar55 - (dVar55 - dVar47))) + (dVar53 - (dVar55 - dVar47));
  dVar61 = dVar35 + dVar55;
  dVar47 = (dVar35 - (dVar61 - (dVar61 - dVar35))) + (dVar55 - (dVar61 - dVar35));
  dVar55 = dVar26 + dVar49;
  dStack_d4630 = (dVar40 - (dVar53 - dVar23)) + (dVar23 - (dVar53 - (dVar53 - dVar23)));
  dStack_d4628 = (dVar49 - (dVar55 - (dVar55 - dVar49))) + (dVar26 - (dVar55 - dVar49));
  dVar35 = dVar24 + dVar32;
  dVar53 = dVar47 + dVar55;
  dVar26 = dVar61 + dVar53;
  dVar61 = (dVar61 - (dVar26 - (dVar26 - dVar61))) + (dVar53 - (dVar26 - dVar61));
  dVar23 = (dVar24 - (dVar35 - (dVar35 - dVar24))) + (dVar32 - (dVar35 - dVar24));
  dVar24 = (dVar47 - (dVar53 - (dVar53 - dVar47))) + (dVar55 - (dVar53 - dVar47));
  dVar32 = dVar24 + dVar23;
  dVar47 = dVar61 + dVar32;
  dVar61 = (dVar61 - (dVar47 - (dVar47 - dVar61))) + (dVar32 - (dVar47 - dVar61));
  dVar53 = dVar26 + dVar47;
  dVar26 = (dVar26 - (dVar53 - (dVar53 - dVar26))) + (dVar47 - (dVar53 - dVar26));
  dVar47 = dVar61 + dVar35;
  dStack_d4620 = (dVar24 - (dVar32 - (dVar32 - dVar24))) + (dVar23 - (dVar32 - dVar24));
  dStack_d4618 = (dVar61 - (dVar47 - (dVar47 - dVar61))) + (dVar35 - (dVar47 - dVar61));
  dVar23 = dVar26 + dVar47;
  dStack_d4600 = dVar53 + dVar23;
  dStack_d4610 = (dVar26 - (dVar23 - (dVar23 - dVar26))) + (dVar47 - (dVar23 - dVar26));
  dStack_d4608 = (dVar53 - (dStack_d4600 - (dStack_d4600 - dVar53))) +
                 (dVar23 - (dStack_d4600 - dVar53));
  iVar7 = fast_expansion_sum_zeroelim(8,&dStack_d44b8,8,&dStack_d4638,adStack_d4f38);
  dVar41 = dVar25 * b_11 - (dVar25 * b_11 - b_11);
  dVar44 = dVar25 * b_03 - (dVar25 * b_03 - b_03);
  dVar26 = b_15 * b_11;
  dVar61 = b_15 * b_03;
  dVar50 = b_11 - dVar41;
  dVar56 = b_03 - dVar44;
  dStack_d44f8 = dVar22 * dVar50 -
                 (((dVar26 - dVar45 * dVar41) - dVar22 * dVar41) - dVar45 * dVar50);
  dStack_d5200 = auVar5._8_8_;
  dVar23 = b_08 * b_11;
  dVar24 = dStack_d5200 * b_03;
  dVar49 = dVar63 * dVar50 - (((dVar23 - dVar58 * dVar41) - dVar63 * dVar41) - dVar58 * dVar50);
  dVar55 = dVar63 * dVar56 - (((dVar24 - dVar58 * dVar44) - dVar63 * dVar44) - dVar58 * dVar56);
  dVar53 = dVar26 + dVar49;
  dVar32 = dVar61 + dVar55;
  dVar35 = dVar23 + dVar53;
  dVar47 = dVar53 - (dVar35 - dVar23);
  dVar40 = dVar22 * dVar56 - (((dVar61 - dVar45 * dVar44) - dVar22 * dVar44) - dVar45 * dVar56);
  dVar23 = (dVar26 - (dVar53 - (dVar53 - dVar26))) + (dVar49 - (dVar53 - dVar26));
  dVar26 = (dVar61 - (dVar32 - (dVar32 - dVar61))) + (dVar55 - (dVar32 - dVar61));
  dVar53 = dVar40 + dVar23;
  dVar55 = dVar47 + dVar53;
  dVar49 = (dVar47 - (dVar55 - (dVar55 - dVar47))) + (dVar53 - (dVar55 - dVar47));
  dVar61 = dVar35 + dVar55;
  dVar47 = (dVar35 - (dVar61 - (dVar61 - dVar35))) + (dVar55 - (dVar61 - dVar35));
  dVar55 = dVar26 + dVar49;
  dStack_d44f0 = (dVar40 - (dVar53 - dVar23)) + (dVar23 - (dVar53 - (dVar53 - dVar23)));
  dStack_d44e8 = (dVar49 - (dVar55 - (dVar55 - dVar49))) + (dVar26 - (dVar55 - dVar49));
  dVar35 = dVar24 + dVar32;
  dVar53 = dVar47 + dVar55;
  dVar26 = dVar61 + dVar53;
  dVar61 = (dVar61 - (dVar26 - (dVar26 - dVar61))) + (dVar53 - (dVar26 - dVar61));
  dVar23 = (dVar24 - (dVar35 - (dVar35 - dVar24))) + (dVar32 - (dVar35 - dVar24));
  dVar24 = (dVar47 - (dVar53 - (dVar53 - dVar47))) + (dVar55 - (dVar53 - dVar47));
  dVar32 = dVar24 + dVar23;
  dVar47 = dVar61 + dVar32;
  dVar61 = (dVar61 - (dVar47 - (dVar47 - dVar61))) + (dVar32 - (dVar47 - dVar61));
  dVar53 = dVar26 + dVar47;
  dVar26 = (dVar26 - (dVar53 - (dVar53 - dVar26))) + (dVar47 - (dVar53 - dVar26));
  dVar47 = dVar61 + dVar35;
  dStack_d44e0 = (dVar24 - (dVar32 - (dVar32 - dVar24))) + (dVar23 - (dVar32 - dVar24));
  dStack_d44d8 = (dVar61 - (dVar47 - (dVar47 - dVar61))) + (dVar35 - (dVar47 - dVar61));
  dVar23 = dVar26 + dVar47;
  dStack_d44c0 = dVar53 + dVar23;
  dStack_d44d0 = (dVar26 - (dVar23 - (dVar23 - dVar26))) + (dVar47 - (dVar23 - dVar26));
  dStack_d44c8 = (dVar53 - (dStack_d44c0 - (dStack_d44c0 - dVar53))) +
                 (dVar23 - (dStack_d44c0 - dVar53));
  dVar32 = dVar25 * b_18 - (dVar25 * b_18 - b_18);
  dVar23 = b_18 - dVar32;
  dVar61 = dVar25 * b_12 - (dVar25 * b_12 - b_12);
  dVar59 = b_12 - dVar61;
  dVar47 = -b_16;
  dVar53 = -b_09;
  dVar49 = dVar25 * dVar47 - (dVar25 * dVar47 + b_16);
  dVar55 = dVar25 * dVar53 - (b_09 + dVar25 * dVar53);
  dVar35 = b_18 * dVar47;
  dVar40 = b_18 * dVar53;
  dVar24 = b_12 * dVar47;
  dVar26 = b_12 * dVar53;
  dVar47 = dVar47 - dVar49;
  dVar53 = dVar53 - dVar55;
  dStack_d4678 = dVar23 * dVar47 -
                 (((dVar35 - dVar32 * dVar49) - dVar23 * dVar49) - dVar32 * dVar47);
  dVar60 = dVar59 * dVar47 - (((dVar24 - dVar61 * dVar49) - dVar59 * dVar49) - dVar61 * dVar47);
  dVar62 = dVar59 * dVar53 - (((dVar26 - dVar61 * dVar55) - dVar59 * dVar55) - dVar61 * dVar53);
  dVar47 = dVar35 + dVar60;
  dVar49 = dVar40 + dVar62;
  dVar42 = dVar24 + dVar47;
  dVar51 = dVar47 - (dVar42 - dVar24);
  dVar24 = dVar53 * dVar23 - (((dVar40 - dVar32 * dVar55) - dVar55 * dVar23) - dVar32 * dVar53);
  dVar47 = (dVar35 - (dVar47 - (dVar47 - dVar35))) + (dVar60 - (dVar47 - dVar35));
  dVar53 = (dVar40 - (dVar49 - (dVar49 - dVar40))) + (dVar62 - (dVar49 - dVar40));
  dVar35 = dVar24 + dVar47;
  dVar55 = dVar51 + dVar35;
  dVar51 = (dVar51 - (dVar55 - (dVar55 - dVar51))) + (dVar35 - (dVar55 - dVar51));
  dVar40 = dVar42 + dVar55;
  dVar55 = (dVar42 - (dVar40 - (dVar40 - dVar42))) + (dVar55 - (dVar40 - dVar42));
  dVar42 = dVar53 + dVar51;
  dStack_d4670 = (dVar24 - (dVar35 - dVar47)) + (dVar47 - (dVar35 - (dVar35 - dVar47)));
  dStack_d4668 = (dVar51 - (dVar42 - (dVar42 - dVar51))) + (dVar53 - (dVar42 - dVar51));
  dVar53 = dVar26 + dVar49;
  dVar35 = dVar55 + dVar42;
  dVar47 = dVar40 + dVar35;
  dVar40 = (dVar40 - (dVar47 - (dVar47 - dVar40))) + (dVar35 - (dVar47 - dVar40));
  dVar24 = (dVar26 - (dVar53 - (dVar53 - dVar26))) + (dVar49 - (dVar53 - dVar26));
  dVar26 = (dVar55 - (dVar35 - (dVar35 - dVar55))) + (dVar42 - (dVar35 - dVar55));
  dVar55 = dVar26 + dVar24;
  dVar42 = dVar40 + dVar55;
  dVar35 = (dVar40 - (dVar42 - (dVar42 - dVar40))) + (dVar55 - (dVar42 - dVar40));
  dVar49 = dVar47 + dVar42;
  dVar47 = (dVar47 - (dVar49 - (dVar49 - dVar47))) + (dVar42 - (dVar49 - dVar47));
  dVar40 = dVar35 + dVar53;
  dStack_d4660 = (dVar26 - (dVar55 - (dVar55 - dVar26))) + (dVar24 - (dVar55 - dVar26));
  dStack_d4658 = (dVar35 - (dVar40 - (dVar40 - dVar35))) + (dVar53 - (dVar40 - dVar35));
  dVar24 = dVar47 + dVar40;
  dStack_d4640 = dVar49 + dVar24;
  dStack_d4650 = (dVar47 - (dVar24 - (dVar24 - dVar47))) + (dVar40 - (dVar24 - dVar47));
  dStack_d4648 = (dVar49 - (dStack_d4640 - (dStack_d4640 - dVar49))) +
                 (dVar24 - (dStack_d4640 - dVar49));
  iVar8 = fast_expansion_sum_zeroelim(8,&dStack_d44f8,8,&dStack_d4678,adStack_d47b8);
  dVar47 = b_17 * dVar25 - (b_17 * dVar25 - b_17);
  dVar53 = b_10 * dVar25 - (b_10 * dVar25 - b_10);
  dVar24 = b_18 * b_17;
  dVar26 = b_10 * b_18;
  dVar35 = b_17 - dVar47;
  dVar40 = b_10 - dVar53;
  dStack_d4538 = dVar23 * dVar35 -
                 (((dVar24 - dVar32 * dVar47) - dVar23 * dVar47) - dVar32 * dVar35);
  dVar55 = b_17 * b_12;
  dVar60 = b_10 * b_12;
  dVar42 = dVar59 * dVar35 - (((dVar55 - dVar61 * dVar47) - dVar59 * dVar47) - dVar61 * dVar35);
  dVar51 = dVar59 * dVar40 - (((dVar60 - dVar61 * dVar53) - dVar59 * dVar53) - dVar61 * dVar40);
  dVar47 = dVar24 + dVar42;
  dVar35 = dVar26 + dVar51;
  dVar49 = dVar55 + dVar47;
  dVar55 = dVar47 - (dVar49 - dVar55);
  dVar53 = dVar40 * dVar23 - (((dVar26 - dVar32 * dVar53) - dVar53 * dVar23) - dVar32 * dVar40);
  dVar24 = (dVar24 - (dVar47 - (dVar47 - dVar24))) + (dVar42 - (dVar47 - dVar24));
  dVar26 = (dVar26 - (dVar35 - (dVar35 - dVar26))) + (dVar51 - (dVar35 - dVar26));
  dVar40 = dVar53 + dVar24;
  dVar42 = dVar55 + dVar40;
  dVar55 = (dVar55 - (dVar42 - (dVar42 - dVar55))) + (dVar40 - (dVar42 - dVar55));
  dVar47 = dVar49 + dVar42;
  dVar49 = (dVar49 - (dVar47 - (dVar47 - dVar49))) + (dVar42 - (dVar47 - dVar49));
  dVar42 = dVar26 + dVar55;
  dStack_d4530 = (dVar53 - (dVar40 - dVar24)) + (dVar24 - (dVar40 - (dVar40 - dVar24)));
  dStack_d4528 = (dVar55 - (dVar42 - (dVar42 - dVar55))) + (dVar26 - (dVar42 - dVar55));
  dVar40 = dVar60 + dVar35;
  dVar53 = dVar49 + dVar42;
  dVar24 = dVar47 + dVar53;
  dVar26 = (dVar47 - (dVar24 - (dVar24 - dVar47))) + (dVar53 - (dVar24 - dVar47));
  dVar55 = (dVar60 - (dVar40 - (dVar40 - dVar60))) + (dVar35 - (dVar40 - dVar60));
  dVar49 = (dVar49 - (dVar53 - (dVar53 - dVar49))) + (dVar42 - (dVar53 - dVar49));
  dVar35 = dVar49 + dVar55;
  dVar47 = dVar26 + dVar35;
  dVar26 = (dVar26 - (dVar47 - (dVar47 - dVar26))) + (dVar35 - (dVar47 - dVar26));
  dVar53 = dVar24 + dVar47;
  dVar24 = (dVar24 - (dVar53 - (dVar53 - dVar24))) + (dVar47 - (dVar53 - dVar24));
  dVar47 = dVar26 + dVar40;
  dStack_d4520 = (dVar49 - (dVar35 - (dVar35 - dVar49))) + (dVar55 - (dVar35 - dVar49));
  dStack_d4518 = (dVar26 - (dVar47 - (dVar47 - dVar26))) + (dVar40 - (dVar47 - dVar26));
  dVar35 = dVar24 + dVar47;
  dStack_d4500 = dVar53 + dVar35;
  dVar26 = (dVar53 - (dStack_d4500 - (dStack_d4500 - dVar53))) + (dVar35 - (dStack_d4500 - dVar53));
  auStack_d4510._8_4_ = SUB84(dVar26,0);
  auStack_d4510._0_8_ = (dVar24 - (dVar35 - (dVar35 - dVar24))) + (dVar47 - (dVar35 - dVar24));
  auStack_d4510._12_4_ = (int)((ulong)dVar26 >> 0x20);
  dVar47 = -b_11;
  dVar53 = -b_03;
  dVar40 = dVar25 * dVar47 - (dVar25 * dVar47 + b_11);
  dVar49 = dVar25 * dVar53 - (b_03 + dVar25 * dVar53);
  dVar25 = b_13 * dVar47;
  dVar35 = b_13 * dVar53;
  dStack_d5340 = auVar3._8_8_;
  dVar24 = b_07 * dVar47;
  dVar26 = dStack_d5340 * dVar53;
  dVar47 = dVar47 - dVar40;
  dVar53 = dVar53 - dVar49;
  dStack_d46b8 = dVar27 * dVar47 -
                 (((dVar25 - dVar18 * dVar40) - dVar27 * dVar40) - dVar18 * dVar47);
  dVar51 = dVar57 * dVar47 - (((dVar24 - dVar19 * dVar40) - dVar57 * dVar40) - dVar19 * dVar47);
  dVar60 = dVar57 * dVar53 - (((dVar26 - dVar19 * dVar49) - dVar57 * dVar49) - dVar19 * dVar53);
  dVar47 = dVar25 + dVar51;
  dVar55 = dVar35 + dVar60;
  dVar42 = dVar24 + dVar47;
  dVar40 = dVar47 - (dVar42 - dVar24);
  dVar24 = dVar53 * dVar27 - (((dVar35 - dVar18 * dVar49) - dVar49 * dVar27) - dVar18 * dVar53);
  dVar25 = (dVar25 - (dVar47 - (dVar47 - dVar25))) + (dVar51 - (dVar47 - dVar25));
  dVar47 = (dVar35 - (dVar55 - (dVar55 - dVar35))) + (dVar60 - (dVar55 - dVar35));
  dVar53 = dVar24 + dVar25;
  dVar51 = dVar40 + dVar53;
  dVar49 = (dVar40 - (dVar51 - (dVar51 - dVar40))) + (dVar53 - (dVar51 - dVar40));
  dVar35 = dVar42 + dVar51;
  dVar40 = (dVar42 - (dVar35 - (dVar35 - dVar42))) + (dVar51 - (dVar35 - dVar42));
  dVar42 = dVar47 + dVar49;
  dStack_d46b0 = (dVar24 - (dVar53 - dVar25)) + (dVar25 - (dVar53 - (dVar53 - dVar25)));
  dStack_d46a8 = (dVar49 - (dVar42 - (dVar42 - dVar49))) + (dVar47 - (dVar42 - dVar49));
  dVar47 = dVar26 + dVar55;
  dVar53 = dVar40 + dVar42;
  dVar25 = dVar35 + dVar53;
  dVar35 = (dVar35 - (dVar25 - (dVar25 - dVar35))) + (dVar53 - (dVar25 - dVar35));
  dVar24 = (dVar26 - (dVar47 - (dVar47 - dVar26))) + (dVar55 - (dVar47 - dVar26));
  dVar26 = (dVar40 - (dVar53 - (dVar53 - dVar40))) + (dVar42 - (dVar53 - dVar40));
  dVar49 = dVar26 + dVar24;
  dVar55 = dVar35 + dVar49;
  dVar53 = (dVar35 - (dVar55 - (dVar55 - dVar35))) + (dVar49 - (dVar55 - dVar35));
  dVar40 = dVar25 + dVar55;
  dVar25 = (dVar25 - (dVar40 - (dVar40 - dVar25))) + (dVar55 - (dVar40 - dVar25));
  dVar35 = dVar53 + dVar47;
  dStack_d46a0 = (dVar26 - (dVar49 - (dVar49 - dVar26))) + (dVar24 - (dVar49 - dVar26));
  dStack_d4698 = (dVar53 - (dVar35 - (dVar35 - dVar53))) + (dVar47 - (dVar35 - dVar53));
  dVar24 = dVar25 + dVar35;
  dStack_d4680 = dVar40 + dVar24;
  dStack_d4690 = (dVar25 - (dVar24 - (dVar24 - dVar25))) + (dVar35 - (dVar24 - dVar25));
  dStack_d4688 = (dVar40 - (dStack_d4680 - (dStack_d4680 - dVar40))) +
                 (dVar24 - (dStack_d4680 - dVar40));
  iVar9 = fast_expansion_sum_zeroelim(8,&dStack_d4538,8,&dStack_d46b8,adStack_d4fb8);
  dVar35 = b_13 * b_16;
  dVar40 = b_13 * b_09;
  dStack_d4578 = dVar27 * dVar48 -
                 (((dVar35 - dVar18 * dVar39) - dVar27 * dVar39) - dVar18 * dVar48);
  dVar24 = b_16 * b_07;
  dStack_d5340 = b_09 * dStack_d5340;
  dVar47 = dVar48 * dVar57 - (((dVar24 - dVar19 * dVar39) - dVar39 * dVar57) - dVar19 * dVar48);
  dVar53 = dVar54 * dVar57 -
           (((dStack_d5340 - dVar19 * dVar43) - dVar43 * dVar57) - dVar19 * dVar54);
  dVar26 = dVar35 + dVar47;
  dVar25 = dVar40 + dVar53;
  dVar19 = dVar24 + dVar26;
  dVar24 = dVar26 - (dVar19 - dVar24);
  dVar27 = dVar54 * dVar27 - (((dVar40 - dVar18 * dVar43) - dVar43 * dVar27) - dVar18 * dVar54);
  dVar35 = (dVar35 - (dVar26 - (dVar26 - dVar35))) + (dVar47 - (dVar26 - dVar35));
  dVar40 = (dVar40 - (dVar25 - (dVar25 - dVar40))) + (dVar53 - (dVar25 - dVar40));
  dVar18 = dVar27 + dVar35;
  dVar26 = dVar24 + dVar18;
  dVar47 = (dVar24 - (dVar26 - (dVar26 - dVar24))) + (dVar18 - (dVar26 - dVar24));
  dVar24 = dVar19 + dVar26;
  dVar26 = (dVar19 - (dVar24 - (dVar24 - dVar19))) + (dVar26 - (dVar24 - dVar19));
  dVar53 = dVar40 + dVar47;
  dStack_d4570 = (dVar27 - (dVar18 - dVar35)) + (dVar35 - (dVar18 - (dVar18 - dVar35)));
  dStack_d4568 = (dVar47 - (dVar53 - (dVar53 - dVar47))) + (dVar40 - (dVar53 - dVar47));
  dVar19 = dStack_d5340 + dVar25;
  dVar47 = dVar26 + dVar53;
  dVar18 = dVar24 + dVar47;
  dVar24 = (dVar24 - (dVar18 - (dVar18 - dVar24))) + (dVar47 - (dVar18 - dVar24));
  dVar35 = (dStack_d5340 - (dVar19 - (dVar19 - dStack_d5340))) + (dVar25 - (dVar19 - dStack_d5340));
  dVar53 = (dVar26 - (dVar47 - (dVar47 - dVar26))) + (dVar53 - (dVar47 - dVar26));
  dVar47 = dVar53 + dVar35;
  dVar26 = dVar24 + dVar47;
  dVar24 = (dVar24 - (dVar26 - (dVar26 - dVar24))) + (dVar47 - (dVar26 - dVar24));
  dVar25 = dVar18 + dVar26;
  dVar18 = (dVar18 - (dVar25 - (dVar25 - dVar18))) + (dVar26 - (dVar25 - dVar18));
  dVar26 = dVar24 + dVar19;
  dStack_d4560 = (dVar53 - (dVar47 - (dVar47 - dVar53))) + (dVar35 - (dVar47 - dVar53));
  dStack_d4558 = (dVar24 - (dVar26 - (dVar26 - dVar24))) + (dVar19 - (dVar26 - dVar24));
  dVar24 = dVar18 + dVar26;
  dStack_d4540 = dVar25 + dVar24;
  dStack_d4550 = (dVar18 - (dVar24 - (dVar24 - dVar18))) + (dVar26 - (dVar24 - dVar18));
  dStack_d4548 = (dVar25 - (dStack_d4540 - (dStack_d4540 - dVar25))) +
                 (dVar24 - (dStack_d4540 - dVar25));
  dVar47 = b_15 * dVar21;
  dVar53 = b_15 * dVar28;
  dStack_d46f8 = dVar22 * dVar46 -
                 (((dVar47 - dVar45 * dVar65) - dVar22 * dVar65) - dVar45 * dVar46);
  dVar21 = b_08 * dVar21;
  dStack_d5200 = dStack_d5200 * dVar28;
  dVar25 = dVar63 * dVar46 - (((dVar21 - dVar58 * dVar65) - dVar65 * dVar63) - dVar58 * dVar46);
  dVar18 = dVar63 * dVar52 -
           (((dStack_d5200 - dVar58 * dVar66) - dVar66 * dVar63) - dVar58 * dVar52);
  dVar24 = dVar47 + dVar25;
  dVar26 = dVar53 + dVar18;
  dVar28 = dVar21 + dVar24;
  dVar21 = dVar24 - (dVar28 - dVar21);
  dVar19 = dVar22 * dVar52 - (((dVar53 - dVar45 * dVar66) - dVar66 * dVar22) - dVar45 * dVar52);
  dVar45 = (dVar47 - (dVar24 - (dVar24 - dVar47))) + (dVar25 - (dVar24 - dVar47));
  dVar58 = (dVar53 - (dVar26 - (dVar26 - dVar53))) + (dVar18 - (dVar26 - dVar53));
  dVar24 = dVar19 + dVar45;
  dVar22 = dVar21 + dVar24;
  dVar25 = (dVar21 - (dVar22 - (dVar22 - dVar21))) + (dVar24 - (dVar22 - dVar21));
  dVar21 = dVar28 + dVar22;
  dVar22 = (dVar28 - (dVar21 - (dVar21 - dVar28))) + (dVar22 - (dVar21 - dVar28));
  dVar18 = dVar58 + dVar25;
  dStack_d46f0 = (dVar19 - (dVar24 - dVar45)) + (dVar45 - (dVar24 - (dVar24 - dVar45)));
  dStack_d46e8 = (dVar25 - (dVar18 - (dVar18 - dVar25))) + (dVar58 - (dVar18 - dVar25));
  dVar25 = dStack_d5200 + dVar26;
  dVar24 = dVar22 + dVar18;
  dVar28 = dVar21 + dVar24;
  dVar21 = (dVar21 - (dVar28 - (dVar28 - dVar21))) + (dVar24 - (dVar28 - dVar21));
  dVar19 = (dStack_d5200 - (dVar25 - (dVar25 - dStack_d5200))) + (dVar26 - (dVar25 - dStack_d5200));
  dVar45 = (dVar22 - (dVar24 - (dVar24 - dVar22))) + (dVar18 - (dVar24 - dVar22));
  dVar18 = dVar45 + dVar19;
  dVar22 = dVar21 + dVar18;
  dVar21 = (dVar21 - (dVar22 - (dVar22 - dVar21))) + (dVar18 - (dVar22 - dVar21));
  dVar24 = dVar28 + dVar22;
  dVar26 = (dVar28 - (dVar24 - (dVar24 - dVar28))) + (dVar22 - (dVar24 - dVar28));
  dVar22 = dVar21 + dVar25;
  dStack_d46e0 = (dVar45 - (dVar18 - (dVar18 - dVar45))) + (dVar19 - (dVar18 - dVar45));
  dStack_d46d8 = (dVar21 - (dVar22 - (dVar22 - dVar21))) + (dVar25 - (dVar22 - dVar21));
  dVar21 = dVar26 + dVar22;
  dStack_d46c0 = dVar24 + dVar21;
  dStack_d46d0 = (dVar26 - (dVar21 - (dVar21 - dVar26))) + (dVar22 - (dVar21 - dVar26));
  dStack_d46c8 = (dVar24 - (dStack_d46c0 - (dStack_d46c0 - dVar24))) +
                 (dVar21 - (dStack_d46c0 - dVar24));
  iVar10 = fast_expansion_sum_zeroelim(8,&dStack_d4578,8,&dStack_d46f8,adStack_d5038);
  dVar18 = b_20 * b_11;
  dVar45 = b_20 * b_03;
  dStack_d45b8 = dVar64 * dVar50 -
                 (((dVar18 - dVar36 * dVar41) - dVar64 * dVar41) - dVar36 * dVar50);
  dVar21 = b_11 * b_21;
  dStack_d5330 = b_03 * dStack_d5330;
  dVar28 = dVar50 * dVar33 - (((dVar21 - dVar38 * dVar41) - dVar41 * dVar33) - dVar38 * dVar50);
  dVar25 = dVar56 * dVar33 -
           (((dStack_d5330 - dVar38 * dVar44) - dVar44 * dVar33) - dVar38 * dVar56);
  dVar22 = dVar18 + dVar28;
  dVar24 = dVar45 + dVar25;
  dVar26 = dVar21 + dVar22;
  dVar21 = dVar22 - (dVar26 - dVar21);
  dVar38 = dVar56 * dVar64 - (((dVar45 - dVar36 * dVar44) - dVar44 * dVar64) - dVar36 * dVar56);
  dVar19 = (dVar18 - (dVar22 - (dVar22 - dVar18))) + (dVar28 - (dVar22 - dVar18));
  dVar36 = (dVar45 - (dVar24 - (dVar24 - dVar45))) + (dVar25 - (dVar24 - dVar45));
  dVar28 = dVar38 + dVar19;
  dVar22 = dVar21 + dVar28;
  dVar25 = (dVar21 - (dVar22 - (dVar22 - dVar21))) + (dVar28 - (dVar22 - dVar21));
  dVar21 = dVar26 + dVar22;
  dVar22 = (dVar26 - (dVar21 - (dVar21 - dVar26))) + (dVar22 - (dVar21 - dVar26));
  dVar18 = dVar36 + dVar25;
  dStack_d45b0 = (dVar38 - (dVar28 - dVar19)) + (dVar19 - (dVar28 - (dVar28 - dVar19)));
  dStack_d45a8 = (dVar25 - (dVar18 - (dVar18 - dVar25))) + (dVar36 - (dVar18 - dVar25));
  dVar28 = dStack_d5330 + dVar24;
  dVar25 = dVar22 + dVar18;
  dVar26 = dVar21 + dVar25;
  dVar21 = (dVar21 - (dVar26 - (dVar26 - dVar21))) + (dVar25 - (dVar26 - dVar21));
  dVar19 = (dStack_d5330 - (dVar28 - (dVar28 - dStack_d5330))) + (dVar24 - (dVar28 - dStack_d5330));
  dVar18 = (dVar22 - (dVar25 - (dVar25 - dVar22))) + (dVar18 - (dVar25 - dVar22));
  dVar25 = dVar18 + dVar19;
  dVar22 = dVar21 + dVar25;
  dVar21 = (dVar21 - (dVar22 - (dVar22 - dVar21))) + (dVar25 - (dVar22 - dVar21));
  dVar24 = dVar26 + dVar22;
  dVar26 = (dVar26 - (dVar24 - (dVar24 - dVar26))) + (dVar22 - (dVar24 - dVar26));
  dVar22 = dVar21 + dVar28;
  dStack_d45a0 = (dVar18 - (dVar25 - (dVar25 - dVar18))) + (dVar19 - (dVar25 - dVar18));
  dStack_d4598 = (dVar21 - (dVar22 - (dVar22 - dVar21))) + (dVar28 - (dVar22 - dVar21));
  dVar21 = dVar26 + dVar22;
  dStack_d4580 = dVar24 + dVar21;
  dStack_d4590 = (dVar26 - (dVar21 - (dVar21 - dVar26))) + (dVar22 - (dVar21 - dVar26));
  dStack_d4588 = (dVar24 - (dStack_d4580 - (dStack_d4580 - dVar24))) +
                 (dVar21 - (dStack_d4580 - dVar24));
  dVar22 = b_18 * dVar20;
  dVar24 = b_18 * dVar30;
  dStack_d4738 = dVar23 * dVar34 -
                 (((dVar22 - dVar32 * dVar29) - dVar23 * dVar29) - dVar32 * dVar34);
  dVar20 = dVar20 * b_12;
  dVar30 = dVar30 * b_12;
  dVar18 = dVar59 * dVar34 - (((dVar20 - dVar61 * dVar29) - dVar29 * dVar59) - dVar61 * dVar34);
  dVar19 = dVar59 * dVar37 - (((dVar30 - dVar61 * dVar31) - dVar31 * dVar59) - dVar61 * dVar37);
  dVar26 = dVar22 + dVar18;
  dVar28 = dVar24 + dVar19;
  dVar25 = dVar20 + dVar26;
  dVar21 = dVar26 - (dVar25 - dVar20);
  dVar36 = dVar23 * dVar37 - (((dVar24 - dVar32 * dVar31) - dVar31 * dVar23) - dVar32 * dVar37);
  dVar22 = (dVar22 - (dVar26 - (dVar26 - dVar22))) + (dVar18 - (dVar26 - dVar22));
  dVar20 = (dVar24 - (dVar28 - (dVar28 - dVar24))) + (dVar19 - (dVar28 - dVar24));
  dVar24 = dVar36 + dVar22;
  dVar23 = dVar21 + dVar24;
  dVar26 = (dVar21 - (dVar23 - (dVar23 - dVar21))) + (dVar24 - (dVar23 - dVar21));
  dVar21 = dVar25 + dVar23;
  dVar23 = (dVar25 - (dVar21 - (dVar21 - dVar25))) + (dVar23 - (dVar21 - dVar25));
  dVar25 = dVar20 + dVar26;
  dStack_d4730 = (dVar36 - (dVar24 - dVar22)) + (dVar22 - (dVar24 - (dVar24 - dVar22)));
  dStack_d4728 = (dVar26 - (dVar25 - (dVar25 - dVar26))) + (dVar20 - (dVar25 - dVar26));
  dVar24 = dVar30 + dVar28;
  dVar20 = dVar23 + dVar25;
  dVar22 = dVar21 + dVar20;
  dVar21 = (dVar21 - (dVar22 - (dVar22 - dVar21))) + (dVar20 - (dVar22 - dVar21));
  dVar28 = (dVar30 - (dVar24 - (dVar24 - dVar30))) + (dVar28 - (dVar24 - dVar30));
  dVar30 = (dVar23 - (dVar20 - (dVar20 - dVar23))) + (dVar25 - (dVar20 - dVar23));
  dVar26 = dVar30 + dVar28;
  dVar20 = dVar21 + dVar26;
  dVar21 = (dVar21 - (dVar20 - (dVar20 - dVar21))) + (dVar26 - (dVar20 - dVar21));
  dVar23 = dVar22 + dVar20;
  dVar20 = (dVar22 - (dVar23 - (dVar23 - dVar22))) + (dVar20 - (dVar23 - dVar22));
  dVar22 = dVar21 + dVar24;
  dStack_d4720 = (dVar30 - (dVar26 - (dVar26 - dVar30))) + (dVar28 - (dVar26 - dVar30));
  dStack_d4718 = (dVar21 - (dVar22 - (dVar22 - dVar21))) + (dVar24 - (dVar22 - dVar21));
  dVar21 = dVar20 + dVar22;
  dStack_d4700 = dVar23 + dVar21;
  dStack_d4710 = (dVar20 - (dVar21 - (dVar21 - dVar20))) + (dVar22 - (dVar21 - dVar20));
  dStack_d4708 = (dVar23 - (dStack_d4700 - (dStack_d4700 - dVar23))) +
                 (dVar21 - (dStack_d4700 - dVar23));
  iVar11 = fast_expansion_sum_zeroelim(8,&dStack_d45b8,8,&dStack_d4738,adStack_d4838);
  dStack_d5458 = -b_00;
  iVar12 = scale_expansion_zeroelim(iVar8,adStack_d47b8,-b_00,adStack_d4e38);
  dStack_d5408 = -b_04;
  iVar13 = scale_expansion_zeroelim(iVar8,adStack_d47b8,-b_04,adStack_d4938);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_d4e38,iVar13,adStack_d4938,adStack_d4b38);
  iVar13 = scale_expansion_zeroelim(iVar11,adStack_d4838,b_01,adStack_d4e38);
  iVar14 = scale_expansion_zeroelim(iVar11,adStack_d4838,b_05,adStack_d4938);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_d4e38,iVar14,adStack_d4938,adStack_d4d38);
  dStack_d5358 = -b_02;
  iVar14 = scale_expansion_zeroelim(iVar7,adStack_d4f38,-b_02,adStack_d4e38);
  dStack_d5328 = -b_06;
  iVar15 = scale_expansion_zeroelim(iVar7,adStack_d4f38,-b_06,adStack_d4938);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,adStack_d4e38,iVar15,adStack_d4938,adStack_d3e38);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_d4b38,iVar13,adStack_d4d38,adStack_d3c38);
  iVar12 = fast_expansion_sum_zeroelim(iVar14,adStack_d3e38,iVar12,adStack_d3c38,adStack_d4438);
  iVar13 = scale_expansion_zeroelim(iVar12,adStack_d4438,b_07,adStack_c6c38);
  iVar13 = scale_expansion_zeroelim(iVar13,adStack_c6c38,b_07,adStack_c8438);
  iVar14 = scale_expansion_zeroelim(iVar12,adStack_d4438,b_13,adStack_cd838);
  uVar16 = scale_expansion_zeroelim(iVar14,adStack_cd838,b_07,adStack_cf038);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_cf038[uVar17] = adStack_cf038[uVar17] + adStack_cf038[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  dVar21 = ((dVar1 - b) - dVar2) + (dVar1 - (b + (dVar1 - b)));
  iVar14 = scale_expansion_zeroelim(iVar14,adStack_cd838,b_13,adStack_c3038);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_c8438,uVar16,adStack_cf038,adStack_b2838);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_b2838,iVar14,adStack_c3038,adStack_bd038);
  iVar14 = scale_expansion_zeroelim(iVar12,adStack_d4438,b_10,adStack_c9038);
  iVar14 = scale_expansion_zeroelim(iVar14,adStack_c9038,b_10,adStack_ca838);
  iVar15 = scale_expansion_zeroelim(iVar12,adStack_d4438,b_17,adStack_cfc38);
  uVar16 = scale_expansion_zeroelim(iVar15,adStack_cfc38,b_10,adStack_d1438);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_d1438[uVar17] = adStack_d1438[uVar17] + adStack_d1438[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  iVar15 = scale_expansion_zeroelim(iVar15,adStack_cfc38,b_17,adStack_c4838);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,adStack_ca838,uVar16,adStack_d1438,adStack_b5838);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,adStack_b5838,iVar15,adStack_c4838,adStack_c1838);
  iVar15 = scale_expansion_zeroelim(iVar12,adStack_d4438,b,adStack_cb438);
  iVar15 = scale_expansion_zeroelim(iVar15,adStack_cb438,b,adStack_ccc38);
  iVar12 = scale_expansion_zeroelim(iVar12,adStack_d4438,dVar21,adStack_d2038);
  uVar16 = scale_expansion_zeroelim(iVar12,adStack_d2038,b,adStack_d3838);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_d3838[uVar17] = adStack_d3838[uVar17] + adStack_d3838[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  iVar12 = scale_expansion_zeroelim(iVar12,adStack_d2038,dVar21,adStack_c6038);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,adStack_ccc38,uVar16,adStack_d3838,adStack_b8838);
  iVar12 = fast_expansion_sum_zeroelim(iVar15,adStack_b8838,iVar12,adStack_c6038,adStack_af838);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_bd038,iVar14,adStack_c1838,adStack_ab038);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_af838,iVar13,adStack_ab038,adStack_87038);
  iVar13 = scale_expansion_zeroelim(iVar9,adStack_d4fb8,b_01,adStack_d4e38);
  iVar14 = scale_expansion_zeroelim(iVar9,adStack_d4fb8,b_05,adStack_d4938);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_d4e38,iVar14,adStack_d4938,adStack_d4b38);
  iVar14 = scale_expansion_zeroelim(iVar10,adStack_d5038,b_02,adStack_d4e38);
  iVar15 = scale_expansion_zeroelim(iVar10,adStack_d5038,b_06,adStack_d4938);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,adStack_d4e38,iVar15,adStack_d4938,adStack_d4d38);
  iVar15 = scale_expansion_zeroelim(iVar8,adStack_d47b8,b,adStack_d4e38);
  iVar8 = scale_expansion_zeroelim(iVar8,adStack_d47b8,dVar21,adStack_d4938);
  iVar8 = fast_expansion_sum_zeroelim(iVar15,adStack_d4e38,iVar8,adStack_d4938,adStack_d3e38);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_d4b38,iVar14,adStack_d4d38,adStack_d3c38);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,adStack_d3e38,iVar13,adStack_d3c38,adStack_d4438);
  iVar13 = scale_expansion_zeroelim(iVar8,adStack_d4438,b_21,adStack_c6c38);
  iVar13 = scale_expansion_zeroelim(iVar13,adStack_c6c38,b_21,adStack_c8438);
  iVar14 = scale_expansion_zeroelim(iVar8,adStack_d4438,b_20,adStack_cd838);
  uVar16 = scale_expansion_zeroelim(iVar14,adStack_cd838,b_21,adStack_cf038);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_cf038[uVar17] = adStack_cf038[uVar17] + adStack_cf038[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  iVar14 = scale_expansion_zeroelim(iVar14,adStack_cd838,b_20,adStack_c3038);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_c8438,uVar16,adStack_cf038,adStack_b2838);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_b2838,iVar14,adStack_c3038,adStack_bd038);
  iVar14 = scale_expansion_zeroelim(iVar8,adStack_d4438,b_19,adStack_c9038);
  iVar14 = scale_expansion_zeroelim(iVar14,adStack_c9038,b_19,adStack_ca838);
  iVar15 = scale_expansion_zeroelim(iVar8,adStack_d4438,b_14,adStack_cfc38);
  uVar16 = scale_expansion_zeroelim(iVar15,adStack_cfc38,b_19,adStack_d1438);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_d1438[uVar17] = adStack_d1438[uVar17] + adStack_d1438[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  iVar15 = scale_expansion_zeroelim(iVar15,adStack_cfc38,b_14,adStack_c4838);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,adStack_ca838,uVar16,adStack_d1438,adStack_b5838);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,adStack_b5838,iVar15,adStack_c4838,adStack_c1838);
  iVar15 = scale_expansion_zeroelim(iVar8,adStack_d4438,b_00,adStack_cb438);
  iVar15 = scale_expansion_zeroelim(iVar15,adStack_cb438,b_00,adStack_ccc38);
  iVar8 = scale_expansion_zeroelim(iVar8,adStack_d4438,b_04,adStack_d2038);
  uVar16 = scale_expansion_zeroelim(iVar8,adStack_d2038,b_00,adStack_d3838);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_d3838[uVar17] = adStack_d3838[uVar17] + adStack_d3838[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  iVar8 = scale_expansion_zeroelim(iVar8,adStack_d2038,b_04,adStack_c6038);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,adStack_ccc38,uVar16,adStack_d3838,adStack_b8838);
  iVar8 = fast_expansion_sum_zeroelim(iVar15,adStack_b8838,iVar8,adStack_c6038,adStack_af838);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_bd038,iVar14,adStack_c1838,adStack_ab038);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,adStack_af838,iVar13,adStack_ab038,adStack_94838);
  iVar13 = scale_expansion_zeroelim(iVar6,adStack_d4eb8,dStack_d5358,adStack_d4e38);
  iVar14 = scale_expansion_zeroelim(iVar6,adStack_d4eb8,dStack_d5328,adStack_d4938);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_d4e38,iVar14,adStack_d4938,adStack_d4b38);
  iVar14 = scale_expansion_zeroelim(iVar11,adStack_d4838,-b,adStack_d4e38);
  iVar11 = scale_expansion_zeroelim(iVar11,adStack_d4838,-dVar21,adStack_d4938);
  iVar11 = fast_expansion_sum_zeroelim(iVar14,adStack_d4e38,iVar11,adStack_d4938,adStack_d4d38);
  iVar14 = scale_expansion_zeroelim(iVar9,adStack_d4fb8,dStack_d5458,adStack_d4e38);
  iVar9 = scale_expansion_zeroelim(iVar9,adStack_d4fb8,dStack_d5408,adStack_d4938);
  iVar9 = fast_expansion_sum_zeroelim(iVar14,adStack_d4e38,iVar9,adStack_d4938,adStack_d3e38);
  iVar11 = fast_expansion_sum_zeroelim(iVar13,adStack_d4b38,iVar11,adStack_d4d38,adStack_d3c38);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,adStack_d3e38,iVar11,adStack_d3c38,adStack_d4438);
  iVar11 = scale_expansion_zeroelim(iVar9,adStack_d4438,b_08,adStack_c6c38);
  iVar11 = scale_expansion_zeroelim(iVar11,adStack_c6c38,b_08,adStack_c8438);
  iVar13 = scale_expansion_zeroelim(iVar9,adStack_d4438,b_15,adStack_cd838);
  uVar16 = scale_expansion_zeroelim(iVar13,adStack_cd838,b_08,adStack_cf038);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_cf038[uVar17] = adStack_cf038[uVar17] + adStack_cf038[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  iVar13 = scale_expansion_zeroelim(iVar13,adStack_cd838,b_15,adStack_c3038);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_c8438,uVar16,adStack_cf038,adStack_b2838);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_b2838,iVar13,adStack_c3038,adStack_bd038);
  iVar13 = scale_expansion_zeroelim(iVar9,adStack_d4438,b_09,adStack_c9038);
  iVar13 = scale_expansion_zeroelim(iVar13,adStack_c9038,b_09,adStack_ca838);
  iVar14 = scale_expansion_zeroelim(iVar9,adStack_d4438,b_16,adStack_cfc38);
  uVar16 = scale_expansion_zeroelim(iVar14,adStack_cfc38,b_09,adStack_d1438);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_d1438[uVar17] = adStack_d1438[uVar17] + adStack_d1438[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  iVar14 = scale_expansion_zeroelim(iVar14,adStack_cfc38,b_16,adStack_c4838);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_ca838,uVar16,adStack_d1438,adStack_b5838);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_b5838,iVar14,adStack_c4838,adStack_c1838);
  iVar14 = scale_expansion_zeroelim(iVar9,adStack_d4438,b_01,adStack_cb438);
  iVar14 = scale_expansion_zeroelim(iVar14,adStack_cb438,b_01,adStack_ccc38);
  iVar9 = scale_expansion_zeroelim(iVar9,adStack_d4438,b_05,adStack_d2038);
  uVar16 = scale_expansion_zeroelim(iVar9,adStack_d2038,b_01,adStack_d3838);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_d3838[uVar17] = adStack_d3838[uVar17] + adStack_d3838[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  iVar9 = scale_expansion_zeroelim(iVar9,adStack_d2038,b_05,adStack_c6038);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,adStack_ccc38,uVar16,adStack_d3838,adStack_b8838);
  iVar9 = fast_expansion_sum_zeroelim(iVar14,adStack_b8838,iVar9,adStack_c6038,adStack_af838);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_bd038,iVar13,adStack_c1838,adStack_ab038);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,adStack_af838,iVar11,adStack_ab038,adStack_a2038);
  iVar11 = scale_expansion_zeroelim(iVar7,adStack_d4f38,b,adStack_d4e38);
  iVar7 = scale_expansion_zeroelim(iVar7,adStack_d4f38,dVar21,adStack_d4938);
  iVar7 = fast_expansion_sum_zeroelim(iVar11,adStack_d4e38,iVar7,adStack_d4938,adStack_d4b38);
  iVar11 = scale_expansion_zeroelim(iVar10,adStack_d5038,dStack_d5458,adStack_d4e38);
  iVar10 = scale_expansion_zeroelim(iVar10,adStack_d5038,dStack_d5408,adStack_d4938);
  iVar10 = fast_expansion_sum_zeroelim(iVar11,adStack_d4e38,iVar10,adStack_d4938,adStack_d4d38);
  iVar11 = scale_expansion_zeroelim(iVar6,adStack_d4eb8,b_01,adStack_d4e38);
  iVar6 = scale_expansion_zeroelim(iVar6,adStack_d4eb8,b_05,adStack_d4938);
  iVar6 = fast_expansion_sum_zeroelim(iVar11,adStack_d4e38,iVar6,adStack_d4938,adStack_d3e38);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,adStack_d4b38,iVar10,adStack_d4d38,adStack_d3c38);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,adStack_d3e38,iVar7,adStack_d3c38,adStack_d4438);
  iVar7 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_12,adStack_c6c38);
  iVar7 = scale_expansion_zeroelim(iVar7,adStack_c6c38,b_12,adStack_c8438);
  iVar10 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_18,adStack_cd838);
  uVar16 = scale_expansion_zeroelim(iVar10,adStack_cd838,b_12,adStack_cf038);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_cf038[uVar17] = adStack_cf038[uVar17] + adStack_cf038[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  iVar10 = scale_expansion_zeroelim(iVar10,adStack_cd838,b_18,adStack_c3038);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,adStack_c8438,uVar16,adStack_cf038,adStack_b2838);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,adStack_b2838,iVar10,adStack_c3038,adStack_bd038);
  iVar10 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_03,adStack_c9038);
  iVar10 = scale_expansion_zeroelim(iVar10,adStack_c9038,b_03,adStack_ca838);
  iVar11 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_11,adStack_cfc38);
  uVar16 = scale_expansion_zeroelim(iVar11,adStack_cfc38,b_03,adStack_d1438);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_d1438[uVar17] = adStack_d1438[uVar17] + adStack_d1438[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  iVar11 = scale_expansion_zeroelim(iVar11,adStack_cfc38,b_11,adStack_c4838);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,adStack_ca838,uVar16,adStack_d1438,adStack_b5838);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,adStack_b5838,iVar11,adStack_c4838,adStack_c1838);
  iVar11 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_02,adStack_cb438);
  iVar11 = scale_expansion_zeroelim(iVar11,adStack_cb438,b_02,adStack_ccc38);
  iVar6 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_06,adStack_d2038);
  uVar16 = scale_expansion_zeroelim(iVar6,adStack_d2038,b_02,adStack_d3838);
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      adStack_d3838[uVar17] = adStack_d3838[uVar17] + adStack_d3838[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  iVar6 = scale_expansion_zeroelim(iVar6,adStack_d2038,b_06,adStack_c6038);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_ccc38,uVar16,adStack_d3838,adStack_b8838);
  iVar6 = fast_expansion_sum_zeroelim(iVar11,adStack_b8838,iVar6,adStack_c6038,adStack_af838);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,adStack_bd038,iVar10,adStack_c1838,adStack_ab038);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,adStack_af838,iVar7,adStack_ab038,adStack_79838);
  iVar7 = fast_expansion_sum_zeroelim(iVar12,adStack_87038,iVar8,adStack_94838,adStack_1b038);
  iVar6 = fast_expansion_sum_zeroelim(iVar9,adStack_a2038,iVar6,adStack_79838,adStack_36038);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,adStack_1b038,iVar6,adStack_36038,adStack_6c040 + 1);
  return adStack_6c040[iVar6];
}

Assistant:

REAL insphereslow(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, cxdy7, dxay7, axcy7, bxdy7;
  INEXACT REAL bxay7, cxby7, dxcy7, axdy7, cxay7, dxby7;
  REAL axby[8], bxcy[8], cxdy[8], dxay[8], axcy[8], bxdy[8];
  REAL bxay[8], cxby[8], dxcy[8], axdy[8], cxay[8], dxby[8];
  REAL ab[16], bc[16], cd[16], da[16], ac[16], bd[16];
  int ablen, bclen, cdlen, dalen, aclen, bdlen;
  REAL temp32a[32], temp32b[32], temp64a[64], temp64b[64], temp64c[64];
  int temp32alen, temp32blen, temp64alen, temp64blen, temp64clen;
  REAL temp128[128], temp192[192];
  int temp128len, temp192len;
  REAL detx[384], detxx[768], detxt[384], detxxt[768], detxtxt[768];
  int xlen, xxlen, xtlen, xxtlen, xtxtlen;
  REAL x1[1536], x2[2304];
  int x1len, x2len;
  REAL dety[384], detyy[768], detyt[384], detyyt[768], detytyt[768];
  int ylen, yylen, ytlen, yytlen, ytytlen;
  REAL y1[1536], y2[2304];
  int y1len, y2len;
  REAL detz[384], detzz[768], detzt[384], detzzt[768], detztzt[768];
  int zlen, zzlen, ztlen, zztlen, ztztlen;
  REAL z1[1536], z2[2304];
  int z1len, z2len;
  REAL detxy[4608];
  int xylen;
  REAL adet[6912], bdet[6912], cdet[6912], ddet[6912];
  int alen, blen, clen, dlen;
  REAL abdet[13824], cddet[13824], deter[27648];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pe[0], aex, aextail);
  Two_Diff(pa[1], pe[1], aey, aeytail);
  Two_Diff(pa[2], pe[2], aez, aeztail);
  Two_Diff(pb[0], pe[0], bex, bextail);
  Two_Diff(pb[1], pe[1], bey, beytail);
  Two_Diff(pb[2], pe[2], bez, beztail);
  Two_Diff(pc[0], pe[0], cex, cextail);
  Two_Diff(pc[1], pe[1], cey, ceytail);
  Two_Diff(pc[2], pe[2], cez, ceztail);
  Two_Diff(pd[0], pe[0], dex, dextail);
  Two_Diff(pd[1], pe[1], dey, deytail);
  Two_Diff(pd[2], pe[2], dez, deztail);

  Two_Two_Product(aex, aextail, bey, beytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -aey;
  negatetail = -aeytail;
  Two_Two_Product(bex, bextail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  ablen = fast_expansion_sum_zeroelim(8, axby, 8, bxay, ab);
  Two_Two_Product(bex, bextail, cey, ceytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bey;
  negatetail = -beytail;
  Two_Two_Product(cex, cextail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  bclen = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, bc);
  Two_Two_Product(cex, cextail, dey, deytail,
                  cxdy7, cxdy[6], cxdy[5], cxdy[4],
                  cxdy[3], cxdy[2], cxdy[1], cxdy[0]);
  cxdy[7] = cxdy7;
  negate = -cey;
  negatetail = -ceytail;
  Two_Two_Product(dex, dextail, negate, negatetail,
                  dxcy7, dxcy[6], dxcy[5], dxcy[4],
                  dxcy[3], dxcy[2], dxcy[1], dxcy[0]);
  dxcy[7] = dxcy7;
  cdlen = fast_expansion_sum_zeroelim(8, cxdy, 8, dxcy, cd);
  Two_Two_Product(dex, dextail, aey, aeytail,
                  dxay7, dxay[6], dxay[5], dxay[4],
                  dxay[3], dxay[2], dxay[1], dxay[0]);
  dxay[7] = dxay7;
  negate = -dey;
  negatetail = -deytail;
  Two_Two_Product(aex, aextail, negate, negatetail,
                  axdy7, axdy[6], axdy[5], axdy[4],
                  axdy[3], axdy[2], axdy[1], axdy[0]);
  axdy[7] = axdy7;
  dalen = fast_expansion_sum_zeroelim(8, dxay, 8, axdy, da);
  Two_Two_Product(aex, aextail, cey, ceytail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;
  negate = -aey;
  negatetail = -aeytail;
  Two_Two_Product(cex, cextail, negate, negatetail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  aclen = fast_expansion_sum_zeroelim(8, axcy, 8, cxay, ac);
  Two_Two_Product(bex, bextail, dey, deytail,
                  bxdy7, bxdy[6], bxdy[5], bxdy[4],
                  bxdy[3], bxdy[2], bxdy[1], bxdy[0]);
  bxdy[7] = bxdy7;
  negate = -bey;
  negatetail = -beytail;
  Two_Two_Product(dex, dextail, negate, negatetail,
                  dxby7, dxby[6], dxby[5], dxby[4],
                  dxby[3], dxby[2], dxby[1], dxby[0]);
  dxby[7] = dxby7;
  bdlen = fast_expansion_sum_zeroelim(8, bxdy, 8, dxby, bd);

  temp32alen = scale_expansion_zeroelim(cdlen, cd, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(cdlen, cd, -beztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(bdlen, bd, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(bdlen, bd, ceztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(bclen, bc, -dez, temp32a);
  temp32blen = scale_expansion_zeroelim(bclen, bc, -deztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, aex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, aex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, aextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, aex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, aextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, aey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, aey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, aeytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, aey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, aeytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, aez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, aez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, aeztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, aez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, aeztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  alen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, adet);

  temp32alen = scale_expansion_zeroelim(dalen, da, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(dalen, da, ceztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(aclen, ac, dez, temp32a);
  temp32blen = scale_expansion_zeroelim(aclen, ac, deztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(cdlen, cd, aez, temp32a);
  temp32blen = scale_expansion_zeroelim(cdlen, cd, aeztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, bex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, bex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, bextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, bex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, bextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, bey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, bey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, beytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, bey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, beytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, bez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, bez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, beztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, bez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, beztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  blen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, bdet);

  temp32alen = scale_expansion_zeroelim(ablen, ab, -dez, temp32a);
  temp32blen = scale_expansion_zeroelim(ablen, ab, -deztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(bdlen, bd, -aez, temp32a);
  temp32blen = scale_expansion_zeroelim(bdlen, bd, -aeztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(dalen, da, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(dalen, da, -beztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, cex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, cex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, cextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, cex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, cextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, cey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, cey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, ceytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, cey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, ceytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, cez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, cez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, ceztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, cez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, ceztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  clen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, cdet);

  temp32alen = scale_expansion_zeroelim(bclen, bc, aez, temp32a);
  temp32blen = scale_expansion_zeroelim(bclen, bc, aeztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(aclen, ac, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(aclen, ac, -beztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(ablen, ab, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(ablen, ab, ceztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, dex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, dex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, dextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, dex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, dextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, dey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, dey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, deytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, dey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, deytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, dez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, dez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, deztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, dez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, deztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  dlen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}